

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::StandardPropertyCaseItemSyntax::StandardPropertyCaseItemSyntax
          (StandardPropertyCaseItemSyntax *this,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *expressions,Token colon,
          PropertyExprSyntax *expr,Token semi)

{
  Token TVar1;
  bool bVar2;
  ExpressionSyntax *pEVar3;
  PropertyExprSyntax *pPVar4;
  ExpressionSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *local_30;
  PropertyExprSyntax *expr_local;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *expressions_local;
  StandardPropertyCaseItemSyntax *this_local;
  Token colon_local;
  
  TVar1 = semi;
  colon_local._0_8_ = colon.info;
  this_local = colon._0_8_;
  local_30 = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)expr;
  expr_local = (PropertyExprSyntax *)expressions;
  expressions_local = (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)this;
  PropertyCaseItemSyntax::PropertyCaseItemSyntax
            (&this->super_PropertyCaseItemSyntax,StandardPropertyCaseItem);
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::SeparatedSyntaxList
            (&this->expressions,(SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)expr_local);
  *(StandardPropertyCaseItemSyntax **)&this->colon = this_local;
  (this->colon).info = (Info *)colon_local._0_8_;
  __range2 = local_30;
  not_null<slang::syntax::PropertyExprSyntax*>::not_null<slang::syntax::PropertyExprSyntax*,void>
            ((not_null<slang::syntax::PropertyExprSyntax*> *)&this->expr,
             (PropertyExprSyntax **)&__range2);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar1.info;
  (this->semi).info = semi.info;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin(&this->expressions);
  _child = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end(&this->expressions);
  while( true ) {
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                          *)&__end2.index,(iterator_base<slang::syntax::ExpressionSyntax_*> *)&child
                        );
    if (!bVar2) break;
    pEVar3 = SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
             iterator_base<slang::syntax::ExpressionSyntax_*>::operator*
                       ((iterator_base<slang::syntax::ExpressionSyntax_*> *)&__end2.index);
    (pEVar3->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ExpressionSyntax_*,_unsigned_long,_slang::syntax::ExpressionSyntax_**,_slang::syntax::ExpressionSyntax_*&>
                  *)&__end2.index);
  }
  pPVar4 = not_null<slang::syntax::PropertyExprSyntax_*>::operator->(&this->expr);
  (pPVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  return;
}

Assistant:

StandardPropertyCaseItemSyntax(const SeparatedSyntaxList<ExpressionSyntax>& expressions, Token colon, PropertyExprSyntax& expr, Token semi) :
        PropertyCaseItemSyntax(SyntaxKind::StandardPropertyCaseItem), expressions(expressions), colon(colon), expr(&expr), semi(semi) {
        this->expressions.parent = this;
        for (auto child : this->expressions)
            child->parent = this;
        this->expr->parent = this;
    }